

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_subq_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = m68ki_cpu.ir >> 9;
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_32_fc((int)(short)uVar1,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.not_z_flag = (-uVar3 | 0xfffffff8) + uVar2;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.x_flag = (~uVar2 & m68ki_cpu.not_z_flag) >> 0x17;
  m68ki_cpu.v_flag = (~m68ki_cpu.not_z_flag & uVar2) >> 0x18;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_32_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_subq_32_aw(void)
{
	uint src = (((REG_IR >> 9) - 1) & 7) + 1;
	uint ea = EA_AW_32();
	uint dst = m68ki_read_32(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);
	FLAG_X = FLAG_C = CFLAG_SUB_32(src, dst, res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);

	m68ki_write_32(ea, FLAG_Z);
}